

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML88591Transcoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XML88591Transcoder::transcodeFrom
          (XML88591Transcoder *this,XMLByte *srcData,XMLSize_t srcCount,XMLCh *toFill,
          XMLSize_t maxChars,XMLSize_t *bytesEaten,uchar *charSizes)

{
  size_t local_60;
  XMLByte *srcEnd;
  XMLCh *destPtr;
  XMLByte *srcPtr;
  XMLSize_t countToDo;
  XMLSize_t *bytesEaten_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  XMLSize_t srcCount_local;
  XMLByte *srcData_local;
  XML88591Transcoder *this_local;
  
  local_60 = maxChars;
  if (srcCount < maxChars) {
    local_60 = srcCount;
  }
  srcEnd = (XMLByte *)toFill;
  destPtr = (XMLCh *)srcData;
  while (destPtr < srcData + local_60) {
    *(ushort *)srcEnd = (ushort)(byte)*destPtr;
    srcEnd = srcEnd + 2;
    destPtr = (XMLCh *)((long)destPtr + 1);
  }
  *bytesEaten = local_60;
  memset(charSizes,1,local_60);
  return local_60;
}

Assistant:

XMLSize_t
XML88591Transcoder::transcodeFrom(  const   XMLByte* const       srcData
                                    , const XMLSize_t            srcCount
                                    ,       XMLCh* const         toFill
                                    , const XMLSize_t            maxChars
                                    ,       XMLSize_t&           bytesEaten
                                    ,       unsigned char* const charSizes)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output chars and the number of bytes in the source.
    //
    const XMLSize_t countToDo = srcCount < maxChars ? srcCount : maxChars;

    //
    //  Loop through the bytes to do and convert over each byte. Its just
    //  a cast to the wide char type.
    //
    const XMLByte*  srcPtr = srcData;
    XMLCh*          destPtr = toFill;
    const XMLByte*  srcEnd = srcPtr + countToDo;
    while (srcPtr < srcEnd)
        *destPtr++ = XMLCh(*srcPtr++);

    // Set the bytes eaten, and set the char size array to the fixed size
    bytesEaten = countToDo;
    memset(charSizes, 1, countToDo);

    // Return the chars we transcoded
    return countToDo;
}